

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O0

Float pbrt::BeamDiffusionSS(Float sigma_s,Float sigma_a,Float g,Float eta,Float r)

{
  int in_EDI;
  float in_XMM0_Da;
  float fVar1;
  Float FVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  float in_XMM1_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  Float cosTheta_o;
  Float d;
  Float ti;
  int i;
  int nSamples;
  Float Ess;
  Float tCrit;
  Float rho;
  Float sigma_t;
  float in_stack_ffffffffffffffc0;
  undefined4 local_2c;
  undefined4 local_24;
  
  Sqr<float>(in_XMM3_Da);
  fVar1 = SafeSqrt(0.0);
  local_24 = 0.0;
  for (local_2c = 0; local_2c < 100; local_2c = local_2c + 1) {
    FVar2 = SampleExponential(0.0,1.3728032e-38);
    fVar5 = in_XMM4_Da * fVar1 + FVar2;
    fVar3 = Sqr<float>(in_XMM4_Da);
    fVar4 = Sqr<float>(fVar5);
    dVar7 = std::sqrt((double)(ulong)(uint)(fVar3 + fVar4));
    fVar5 = fVar5 / SUB84(dVar7,0);
    fVar4 = in_XMM0_Da / (in_XMM1_Da + in_XMM0_Da);
    fVar3 = FastExp(in_stack_ffffffffffffffc0);
    fVar3 = fVar4 * fVar3;
    fVar6 = Sqr<float>(SUB84(dVar7,0));
    FVar2 = HenyeyGreenstein(fVar3,fVar4);
    fVar3 = (fVar3 / fVar6) * FVar2;
    FVar2 = FrDielectric(in_stack_ffffffffffffffc0,fVar3);
    in_stack_ffffffffffffffc0 = fVar3 * (1.0 - FVar2);
    std::abs(in_EDI);
    local_24 = in_stack_ffffffffffffffc0 * fVar5 + local_24;
  }
  return local_24 / 100.0;
}

Assistant:

Float BeamDiffusionSS(Float sigma_s, Float sigma_a, Float g, Float eta, Float r) {
    // Compute material parameters and minimum $t$ below the critical angle
    Float sigma_t = sigma_a + sigma_s, rho = sigma_s / sigma_t;
    Float tCrit = r * SafeSqrt(Sqr(eta) - 1);

    Float Ess = 0;
    const int nSamples = 100;
    for (int i = 0; i < nSamples; ++i) {
        // Evaluate single-scattering integrand and add to _Ess_
        Float ti = tCrit + SampleExponential((i + 0.5f) / nSamples, sigma_t);
        // Determine length $d$ of connecting segment and $\cos\theta_\roman{o}$
        Float d = std::sqrt(Sqr(r) + Sqr(ti));
        Float cosTheta_o = ti / d;

        // Add contribution of single scattering at depth $t$
        Ess += rho * FastExp(-sigma_t * (d + tCrit)) / Sqr(d) *
               HenyeyGreenstein(cosTheta_o, g) * (1 - FrDielectric(-cosTheta_o, eta)) *
               std::abs(cosTheta_o);
    }
    return Ess / nSamples;
}